

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableNameLengthCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Node *pNVar2;
  TestNode *pTVar3;
  Node *pNVar4;
  SharedPtrStateBase *pSVar5;
  deInt32 *pdVar6;
  SharedPtr unsized;
  string local_50;
  
  pTVar3 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,context->m_testCtx,"sized","Sized target");
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar3[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1af8059);
  generateBufferBackedVariableAggregateTypeCases
            (context,parentStructure,(TestCaseGroup *)pTVar3,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_NAME_LENGTH,TYPE_FLOAT,&local_50,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pNVar4 = (Node *)operator_new(0x28);
  pNVar2 = parentStructure->m_ptr;
  pSVar5 = parentStructure->m_state;
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b298;
  pNVar4->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar4->m_enclosingNode).m_ptr = pNVar2;
  (pNVar4->m_enclosingNode).m_state = pSVar5;
  if (pSVar5 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar5->strongRefCount = pSVar5->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar6 = &((pNVar4->m_enclosingNode).m_state)->weakRefCount;
    *pdVar6 = *pdVar6 + 1;
    UNLOCK();
  }
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0216b3d8;
  *(undefined4 *)&pNVar4[1]._vptr_Node = 0xfffffffe;
  unsized.m_state = (SharedPtrStateBase *)0x0;
  unsized.m_ptr = pNVar4;
  pSVar5 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar5->strongRefCount = 0;
  pSVar5->weakRefCount = 0;
  pSVar5->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_0216b2b8;
  pSVar5[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar4;
  pSVar5->strongRefCount = 1;
  pSVar5->weakRefCount = 1;
  unsized.m_state = pSVar5;
  pTVar3 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,context->m_testCtx,"unsized","Unsized target");
  pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_02160970;
  pTVar3[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar3);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,0x1af8059);
  generateBufferBackedVariableAggregateTypeCases
            (context,&unsized,(TestCaseGroup *)pTVar3,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_NAME_LENGTH,TYPE_FLOAT,&local_50,2);
  pdVar6 = &pSVar5->strongRefCount;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pSVar5 = unsized.m_state;
  LOCK();
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if (*pdVar6 == 0) {
    unsized.m_ptr = (Node *)0x0;
    (*(unsized.m_state)->_vptr_SharedPtrStateBase[2])(unsized.m_state);
  }
  LOCK();
  pdVar6 = &pSVar5->weakRefCount;
  *pdVar6 = *pdVar6 + -1;
  UNLOCK();
  if ((*pdVar6 == 0) && (unsized.m_state != (SharedPtrStateBase *)0x0)) {
    (*(unsized.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  return;
}

Assistant:

static void generateBufferVariableNameLengthCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup)
{
	// .sized
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "sized", "Sized target");
		targetGroup->addChild(blockGroup);

		generateBufferBackedVariableAggregateTypeCases(context, parentStructure, blockGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, PROGRAMRESOURCEPROP_NAME_LENGTH, glu::TYPE_FLOAT, "", 3);
	}

	// .unsized
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		tcu::TestCaseGroup* const					blockGroup	= new TestCaseGroup(context, "unsized", "Unsized target");
		targetGroup->addChild(blockGroup);

		generateBufferBackedVariableAggregateTypeCases(context, unsized, blockGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, PROGRAMRESOURCEPROP_NAME_LENGTH, glu::TYPE_FLOAT, "", 2);
	}
}